

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# renderer.hpp
# Opt level: O2

void __thiscall inja::Renderer::visit(Renderer *this,ExtendsStatementNode *node)

{
  const_iterator cVar1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  cVar1 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_inja::Template>_>_>
          ::find(&this->template_storage->_M_t,&node->file);
  if ((_Rb_tree_header *)cVar1._M_node ==
      &(this->template_storage->_M_t)._M_impl.super__Rb_tree_header) {
    if ((this->config).throw_at_missing_includes == true) {
      ::std::operator+(&local_40,"extends \'",&node->file);
      ::std::operator+(&local_60,&local_40,"\' not found");
      throw_renderer_error(this,&local_60,(AstNode *)node);
      ::std::__cxx11::string::~string((string *)&local_60);
      ::std::__cxx11::string::~string((string *)&local_40);
    }
  }
  else {
    render_to(this,this->output_stream,(Template *)(cVar1._M_node + 2),this->data_input,
              &this->additional_data);
    this->break_rendering = true;
  }
  return;
}

Assistant:

void visit(const ExtendsStatementNode& node) {
    const auto included_template_it = template_storage.find(node.file);
    if (included_template_it != template_storage.end()) {
      const Template* parent_template = &included_template_it->second;
      render_to(*output_stream, *parent_template, *data_input, &additional_data);
      break_rendering = true;
    } else if (config.throw_at_missing_includes) {
      throw_renderer_error("extends '" + node.file + "' not found", node);
    }
  }